

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit_percent.cpp
# Opt level: O2

void __thiscall
duckdb::LimitPercentGlobalState::LimitPercentGlobalState
          (LimitPercentGlobalState *this,ClientContext *context,PhysicalLimitPercent *op)

{
  LimitNodeType LVar1;
  double dVar2;
  bool bVar3;
  idx_t index;
  InternalException *pIVar4;
  allocator local_61;
  string local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__LimitPercentGlobalState_027b8b40;
  this->current_offset = 0;
  (this->offset).index = 0xffffffffffffffff;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,
             &(op->super_PhysicalOperator).types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ColumnDataCollection::ColumnDataCollection
            (&this->data,context,(vector<duckdb::LogicalType,_true> *)&local_40,
             BUFFER_MANAGER_ALLOCATOR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  this->is_limit_set = false;
  LVar1 = (op->limit_val).type;
  if (LVar1 == CONSTANT_PERCENTAGE) {
    dVar2 = BoundLimitNode::GetConstantPercentage(&op->limit_val);
    this->limit_percent = dVar2;
    bVar3 = true;
  }
  else {
    if (LVar1 != EXPRESSION_PERCENTAGE) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,"Unsupported type for limit value in PhysicalLimitPercent",
                 &local_61);
      InternalException::InternalException(pIVar4,&local_60);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar3 = false;
  }
  this->is_limit_set = bVar3;
  LVar1 = (op->offset_val).type;
  if (LVar1 == UNSET) {
    (this->offset).index = 0;
  }
  else if (LVar1 != EXPRESSION_VALUE) {
    if (LVar1 != CONSTANT_VALUE) {
      pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_60,"Unsupported type for offset value in PhysicalLimitPercent",
                 &local_61);
      InternalException::InternalException(pIVar4,&local_60);
      __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    index = BoundLimitNode::GetConstantValue(&op->offset_val);
    optional_idx::optional_idx((optional_idx *)&local_60,index);
    (this->offset).index = (idx_t)local_60._M_dataplus._M_p;
  }
  return;
}

Assistant:

explicit LimitPercentGlobalState(ClientContext &context, const PhysicalLimitPercent &op)
	    : current_offset(0), data(context, op.GetTypes()) {
		switch (op.limit_val.Type()) {
		case LimitNodeType::CONSTANT_PERCENTAGE:
			this->limit_percent = op.limit_val.GetConstantPercentage();
			this->is_limit_set = true;
			break;
		case LimitNodeType::EXPRESSION_PERCENTAGE:
			this->is_limit_set = false;
			break;
		default:
			throw InternalException("Unsupported type for limit value in PhysicalLimitPercent");
		}
		switch (op.offset_val.Type()) {
		case LimitNodeType::CONSTANT_VALUE:
			this->offset = op.offset_val.GetConstantValue();
			break;
		case LimitNodeType::UNSET:
			this->offset = 0;
			break;
		case LimitNodeType::EXPRESSION_VALUE:
			break;
		default:
			throw InternalException("Unsupported type for offset value in PhysicalLimitPercent");
		}
	}